

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O3

ON_ClippingRegionPoints * __thiscall
ON_ClippingRegionPoints::operator=(ON_ClippingRegionPoints *this,ON_ClippingRegionPoints *src)

{
  undefined4 *puVar1;
  ON_3dPoint *pOVar2;
  uint *puVar3;
  double dVar4;
  double *pdVar5;
  uint *puVar6;
  ON_3dPoint *pOVar7;
  uint uVar8;
  ON_3dPoint *pOVar9;
  long lVar10;
  
  if (this == src) {
    return this;
  }
  this->m_point_count = 0;
  this->m_and_clip_flags = 0;
  this->m_or_clip_flags = 0;
  if ((ulong)src->m_point_count == 0) {
    return this;
  }
  if (src->m_clip_points == (ON_3dPoint *)0x0) {
    return this;
  }
  if (src->m_clip_flags == (uint *)0x0) {
    return this;
  }
  ReserveBufferPointCapacity(this,(ulong)src->m_point_count);
  puVar6 = src->m_clip_flags;
  uVar8 = src->m_point_count;
  if ((ulong)uVar8 == 0) {
    pOVar7 = src->m_clip_points;
  }
  else {
    puVar3 = this->m_clip_flags;
    lVar10 = 0;
    do {
      puVar1 = (undefined4 *)((long)puVar3 + lVar10);
      *puVar1 = *(undefined4 *)((long)puVar6 + lVar10);
      lVar10 = lVar10 + 4;
    } while (puVar1 + 1 < puVar3 + uVar8);
    pOVar7 = src->m_clip_points;
    if ((ulong)src->m_point_count != 0) {
      pOVar9 = this->m_clip_points;
      pOVar2 = pOVar9 + src->m_point_count;
      do {
        pOVar9->z = pOVar7->z;
        pdVar5 = &pOVar7->x;
        dVar4 = pOVar7->y;
        pOVar7 = pOVar7 + 1;
        pOVar9->x = *pdVar5;
        pOVar9->y = dVar4;
        pOVar9 = pOVar9 + 1;
      } while (pOVar9 < pOVar2);
      uVar8 = src->m_point_count;
      pOVar7 = src->m_clip_points;
      puVar6 = src->m_clip_flags;
      goto LAB_003ddb4f;
    }
  }
  uVar8 = 0;
LAB_003ddb4f:
  this->m_point_count = uVar8;
  this->m_point_capacity = src->m_point_capacity;
  this->m_clip_points = pOVar7;
  this->m_clip_flags = puVar6;
  uVar8 = src->m_or_clip_flags;
  this->m_and_clip_flags = src->m_and_clip_flags;
  this->m_or_clip_flags = uVar8;
  return this;
}

Assistant:

ON_ClippingRegionPoints& ON_ClippingRegionPoints::operator=(const ON_ClippingRegionPoints& src)
{
  if (this != &src)
  {
    Clear();
    if (src.m_point_count > 0 && nullptr != src.m_clip_points && nullptr != src.m_clip_flags)
    {
      ReserveBufferPointCapacity(src.m_point_count);

      const unsigned int* src_f = src.m_clip_flags;
      unsigned int* f = m_clip_flags;
      unsigned int* f1 = f + src.m_point_count;
      while (f < f1 )
        *f++ = *src_f++;

      const ON_3dPoint* src_p = src.m_clip_points;
      ON_3dPoint* p = m_clip_points;
      ON_3dPoint* p1 = p + src.m_point_count;
      while (p < p1)
        *p++ = *src_p++;

      m_point_count = src.m_point_count;
      m_point_capacity = src.m_point_capacity;
      m_clip_points = src.m_clip_points;
      m_clip_flags = src.m_clip_flags;
      m_and_clip_flags = src.m_and_clip_flags;
      m_or_clip_flags = src.m_or_clip_flags;
    }
  }
  return *this;
}